

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int stream_obq_move(nghttp2_stream *dest,nghttp2_stream *src,nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  nghttp2_stream *src_local;
  nghttp2_stream *dest_local;
  
  if (stream->queued == '\0') {
    dest_local._4_4_ = 0;
  }
  else {
    nghttp2_pq_remove(&src->obq,&stream->pq_entry);
    stream->queued = '\0';
    dest_local._4_4_ = stream_obq_push(dest,stream);
  }
  return dest_local._4_4_;
}

Assistant:

static int stream_obq_move(nghttp2_stream *dest, nghttp2_stream *src,
                           nghttp2_stream *stream) {
  if (!stream->queued) {
    return 0;
  }

  DEBUGF("stream: remove stream %d from stream %d (move)\n", stream->stream_id,
         src->stream_id);

  nghttp2_pq_remove(&src->obq, &stream->pq_entry);
  stream->queued = 0;

  return stream_obq_push(dest, stream);
}